

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGenerator::cmInstallGenerator
          (cmInstallGenerator *this,char *destination,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all)

{
  char *__s;
  allocator<char> local_6d;
  MessageLevel local_6c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_6c = message;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_INSTALL_CONFIG_NAME",&local_6d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,configurations);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_50,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallGenerator_005629a8;
  if (destination == (char *)0x0) {
    destination = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->Destination,destination,&local_6d);
  __s = "";
  if (component != (char *)0x0) {
    __s = component;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->Component,__s,&local_6d);
  this->Message = local_6c;
  this->ExcludeFromAll = exclude_from_all;
  return;
}

Assistant:

cmInstallGenerator::cmInstallGenerator(
  const char* destination, std::vector<std::string> const& configurations,
  const char* component, MessageLevel message, bool exclude_from_all)
  : cmScriptGenerator("CMAKE_INSTALL_CONFIG_NAME", configurations)
  , Destination(destination ? destination : "")
  , Component(component ? component : "")
  , Message(message)
  , ExcludeFromAll(exclude_from_all)
{
}